

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.hpp
# Opt level: O0

void __thiscall czh::lexer::Lexer::skip(Lexer *this)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  Pos *pPVar6;
  allocator<char> local_f9;
  string local_f8;
  Pos local_d8;
  undefined1 local_b8 [8];
  Token tmp;
  Pos local_58;
  undefined1 local_38 [8];
  Pos bak;
  int notes;
  Lexer *this_local;
  
  while( true ) {
    bVar1 = check_char(this);
    bVar3 = false;
    if (bVar1) {
      sVar5 = get_character_size(this);
      bVar3 = false;
      if (sVar5 == 1) {
        iVar4 = isspace((int)this->ch);
        bVar3 = iVar4 != 0;
      }
    }
    if (!bVar3) break;
    cVar2 = get_char(this);
    this->ch = cVar2;
  }
  while( true ) {
    bVar1 = check_char(this);
    bVar3 = false;
    if (bVar1) {
      bVar3 = this->ch == '<';
    }
    if (!bVar3) break;
    bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
         = 0;
    get_pos(&local_58,this);
    pPVar6 = czh::token::Pos::set_size(&local_58,1);
    czh::token::Pos::Pos((Pos *)local_38,pPVar6);
    czh::token::Pos::~Pos(&local_58);
    cVar2 = get_char(this);
    this->ch = cVar2;
    while( true ) {
      bVar1 = check_char(this);
      bVar3 = false;
      if (bVar1) {
        bVar3 = this->ch != '>' ||
                bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi._4_4_ != 0;
      }
      if (!bVar3) break;
      if (this->ch == '<') {
        bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi._4_4_ + 1;
      }
      if (this->ch == '>') {
        bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ = bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi._4_4_ + -1;
      }
      cVar2 = get_char(this);
      this->ch = cVar2;
    }
    if ((bak.code.super___shared_ptr<czh::file::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
         _4_4_ != 0) && (bVar3 = check_char(this), !bVar3)) {
      czh::token::Pos::Pos(&local_d8,(Pos *)local_38);
      czh::token::Token::Token<int>((Token *)local_b8,UNEXPECTED,0x3c,&local_d8);
      czh::token::Pos::~Pos(&local_d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f8,"Expected \'>\' to match this \'<\'.",&local_f9);
      czh::token::Token::report_error((Token *)local_b8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::allocator<char>::~allocator(&local_f9);
      czh::token::Token::~Token((Token *)local_b8);
    }
    if (this->ch == '>') {
      cVar2 = get_char(this);
      this->ch = cVar2;
    }
    czh::token::Pos::~Pos((Pos *)local_38);
  }
  return;
}

Assistant:

void skip()
    {
      while (check_char() && get_character_size() == 1 && isspace(ch))
      {
        ch = get_char();
      }
      while (check_char() && ch == '<')
      {
        int notes = 0;
        auto bak = get_pos().set_size(1);
        ch = get_char();
        while (check_char() && !(ch == '>' && notes == 0))
        {
          if (ch == '<') ++notes;
          if (ch == '>') --notes;
          ch = get_char();
        }
        if (notes != 0 && !check_char())
        {
          token::Token tmp(token::TokenType::UNEXPECTED, static_cast<int>('<'), bak);
          tmp.report_error("Expected '>' to match this '<'.");
        }
        if (ch == '>')
        {
          ch = get_char();
        }
      }
    }